

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

void RemovePidFile(ArgsManager *args)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  char *in_RDI;
  long in_FS_OFFSET;
  error_code error;
  string msg;
  path pid_path;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  path *in_stack_ffffffffffffff10;
  error_code *in_stack_ffffffffffffff20;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff28;
  ArgsManager *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  LogFlags in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff7c;
  error_code local_80 [3];
  ConstevalFormatString<2U> in_stack_ffffffffffffffb8;
  string_view in_stack_ffffffffffffffc0;
  string_view in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (g_generated_pid) {
    GetPidFile(in_stack_ffffffffffffff48);
    std::error_code::error_code
              ((error_code *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    uVar3 = std::filesystem::remove((path *)&stack0xffffffffffffffd0,local_80);
    if ((uVar3 & 1) == 0) {
      bVar2 = std::error_code::operator_cast_to_bool
                        ((error_code *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
                        );
      if (bVar2) {
        std::error_code::message_abi_cxx11_(in_stack_ffffffffffffff20);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffff58,in_RDI,(allocator<char> *)in_stack_ffffffffffffff48);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20);
      fs::PathToString_abi_cxx11_(in_stack_ffffffffffffff10);
      in_stack_ffffffffffffff08 = 2;
      LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc0,in_stack_ffffffffffffff7c,
                 in_stack_ffffffffffffff70,(Level)msg._M_string_length,in_stack_ffffffffffffffb8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 msg.field_2._8_8_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 pid_path.super_path._M_pathname._M_dataplus._M_p);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    }
    fs::path::~path((path *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void RemovePidFile(const ArgsManager& args)
{
    if (!g_generated_pid) return;
    const auto pid_path{GetPidFile(args)};
    if (std::error_code error; !fs::remove(pid_path, error)) {
        std::string msg{error ? error.message() : "File does not exist"};
        LogPrintf("Unable to remove PID file (%s): %s\n", fs::PathToString(pid_path), msg);
    }
}